

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O0

void Gia_ManResubPerform(Gia_ResbMan_t *p,Vec_Ptr_t *vDivs,int nWords,int nLimit,int nDivsMax,
                        int iChoice,int fUseXor,int fDebug,int fVerbose)

{
  int Entry;
  int Res;
  int iChoice_local;
  int nDivsMax_local;
  int nLimit_local;
  int nWords_local;
  Vec_Ptr_t *vDivs_local;
  Gia_ResbMan_t *p_local;
  
  Gia_ResbInit(p,vDivs,nWords,nLimit,nDivsMax,iChoice,fUseXor,fDebug,fVerbose,fVerbose);
  Entry = Gia_ManResubPerform_rec(p,nLimit);
  if (-1 < Entry) {
    Vec_IntPush(p->vGates,Entry);
  }
  if (fVerbose != 0) {
    printf("\n");
  }
  return;
}

Assistant:

void Gia_ManResubPerform( Gia_ResbMan_t * p, Vec_Ptr_t * vDivs, int nWords, int nLimit, int nDivsMax, int iChoice, int fUseXor, int fDebug, int fVerbose )
{
    int Res;
    Gia_ResbInit( p, vDivs, nWords, nLimit, nDivsMax, iChoice, fUseXor, fDebug, fVerbose, fVerbose );
    Res = Gia_ManResubPerform_rec( p, nLimit );
    if ( Res >= 0 ) Vec_IntPush( p->vGates, Res );
    if ( fVerbose )
        printf( "\n" );
}